

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O2

void __thiscall QKeySequenceEdit::QKeySequenceEdit(QKeySequenceEdit *this,QWidget *parent)

{
  QKeySequenceEditPrivate *this_00;
  
  this_00 = (QKeySequenceEditPrivate *)operator_new(0x2a0);
  QKeySequenceEditPrivate::QKeySequenceEditPrivate(this_00);
  QKeySequenceEdit(this,this_00,parent,(WindowFlags)0x0);
  return;
}

Assistant:

QKeySequenceEdit::QKeySequenceEdit(QWidget *parent)
    : QKeySequenceEdit(*new QKeySequenceEditPrivate, parent, { })
{
}